

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_resolv_check(Curl_easy *data,Curl_dns_entry **dns)

{
  dynbuf *s;
  byte bVar1;
  DNStype DVar2;
  int iVar3;
  dohdata *pdVar4;
  sockaddr *psVar5;
  undefined8 uVar6;
  char *pcVar7;
  DOHcode DVar8;
  DNStype DVar9;
  CURLcode CVar10;
  uchar *puVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  Curl_addrinfo *pCVar16;
  Curl_dns_entry *pCVar17;
  sa_family_t sVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  ushort uVar22;
  uint uVar23;
  long lVar24;
  Curl_addrinfo *pCVar25;
  ushort uVar26;
  Curl_addrinfo *addr;
  dynbuf *s_00;
  uint uVar27;
  size_t sVar28;
  dohentry *s_01;
  ushort uVar29;
  ulong uVar30;
  anon_union_16_2_f9ece763_for_ip *paVar31;
  bool bVar32;
  DOHcode aDStack_340 [2];
  ulong uStack_338;
  Curl_dns_entry **ppCStack_330;
  uint auStack_328 [2];
  char acStack_31e [126];
  dohentry dStack_2a0;
  
  if (((data->conn->bits).field_0x7 & 8) == 0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pdVar4 = (data->req).doh;
  *dns = (Curl_dns_entry *)0x0;
  if (pdVar4 == (dohdata *)0x0) {
LAB_0045f881:
    CVar10 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if ((pdVar4->probe[0].easy == (CURL_conflict *)0x0) &&
       (pdVar4->probe[1].easy == (CURL_conflict *)0x0)) {
      Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
      return (((data->conn->bits).field_0x4 & 0x20) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
    }
    if (pdVar4->pending != 0) {
      return CURLE_OK;
    }
    aDStack_340[0] = DOH_OK;
    aDStack_340[1] = DOH_OK;
    ppCStack_330 = dns;
    for (lVar24 = 8; lVar24 != 0x478; lVar24 = lVar24 + 0x238) {
      curl_multi_remove_handle
                (data->multi,*(Curl_easy **)(pdVar4->probe[0].dohbuffer + lVar24 + -0x14));
      Curl_close((Curl_easy **)(pdVar4->probe[0].dohbuffer + lVar24 + -0x14));
    }
    memset(&dStack_2a0,0,0x270);
    dStack_2a0.ttl = 0x7fffffff;
    for (lVar24 = 0; lVar24 != 0x80; lVar24 = lVar24 + 0x20) {
      Curl_dyn_init((dynbuf *)((long)&dStack_2a0.cname[0].bufr + lVar24),0x100);
    }
    lVar24 = 0;
LAB_0045ef7a:
    if (lVar24 != 2) {
      if (pdVar4->probe[lVar24].dnstype != 0) {
        s = &pdVar4->probe[lVar24].serverdoh;
        puVar11 = Curl_dyn_uptr(s);
        sVar12 = Curl_dyn_len(s);
        DVar2 = pdVar4->probe[lVar24].dnstype;
        auStack_328[0] = 0xc;
        DVar8 = DOH_TOO_SMALL_BUFFER;
        if ((((0xb < sVar12) && (DVar8 = DOH_DNS_BAD_ID, puVar11 != (uchar *)0x0)) &&
            (*puVar11 == '\0')) &&
           ((puVar11[1] == '\0' && (DVar8 = DOH_DNS_BAD_RCODE, (puVar11[3] & 0xf) == 0)))) {
          uVar29 = *(ushort *)(puVar11 + 4) << 8 | *(ushort *)(puVar11 + 4) >> 8;
          sVar28 = 0xc;
          uVar23 = auStack_328[0];
          do {
            auStack_328[0] = uVar23;
            bVar32 = uVar29 == 0;
            uVar29 = uVar29 - 1;
            if (bVar32) {
              uVar29 = *(ushort *)(puVar11 + 6) << 8 | *(ushort *)(puVar11 + 6) >> 8;
              uVar26 = 0;
              uVar23 = auStack_328[0];
              goto LAB_0045f06e;
            }
            DVar8 = skipqname(puVar11,sVar12,auStack_328);
            if (DVar8 != DOH_OK) goto LAB_0045f42d;
            sVar28 = (size_t)(auStack_328[0] + 4);
            uVar23 = auStack_328[0] + 4;
          } while (sVar28 <= sVar12);
          DVar8 = DOH_DNS_OUT_OF_RANGE;
        }
        goto LAB_0045f42d;
      }
      goto LAB_0045f48e;
    }
    CVar10 = CURLE_COULDNT_RESOLVE_HOST;
    if ((aDStack_340[0] == DOH_OK) || (aDStack_340[1] == 0)) {
      Curl_infof(data,"DoH Host name: %s",pdVar4->host);
      puVar11 = dStack_2a0.addr[0].ip.v4 + 1;
      Curl_infof(data,"TTL: %u seconds",(ulong)dStack_2a0.ttl);
      for (lVar24 = 0; lVar24 < dStack_2a0.numaddr; lVar24 = lVar24 + 1) {
        iVar3 = dStack_2a0.addr[lVar24].type;
        if (iVar3 == 0x1c) {
          curl_msnprintf((char *)auStack_328,0x80,"DoH AAAA: ");
          pcVar21 = acStack_31e;
          sVar12 = 0x76;
          for (uVar30 = 0; uVar30 < 0x10; uVar30 = uVar30 + 2) {
            pcVar7 = "    :";
            if (uVar30 == 0) {
              pcVar7 = "PK\x01\x02";
            }
            curl_msnprintf(pcVar21,sVar12,"%s%02x%02x",pcVar7 + 4,(ulong)puVar11[uVar30 - 1],
                           (ulong)puVar11[uVar30]);
            sVar15 = strlen(pcVar21);
            sVar12 = sVar12 - sVar15;
            pcVar21 = pcVar21 + sVar15;
          }
          Curl_infof(data,"%s",auStack_328);
        }
        else if (iVar3 == 1) {
          Curl_infof(data,"DoH A: %u.%u.%u.%u",(ulong)dStack_2a0.addr[lVar24].ip.v4[0],
                     (ulong)dStack_2a0.addr[lVar24].ip.v4[1],(ulong)dStack_2a0.addr[lVar24].ip.v4[2]
                     ,(ulong)dStack_2a0.addr[lVar24].ip.v4[3]);
        }
        puVar11 = puVar11 + 0x14;
      }
      s_01 = &dStack_2a0;
      for (lVar24 = 0; lVar24 < dStack_2a0.numcname; lVar24 = lVar24 + 1) {
        pcVar21 = Curl_dyn_ptr(s_01->cname);
        Curl_infof(data,"CNAME: %s",pcVar21);
        s_01 = (dohentry *)(s_01->cname + 1);
      }
      pcVar21 = pdVar4->host;
      uVar29 = (ushort)pdVar4->port;
      sVar15 = strlen(pcVar21);
      paVar31 = &dStack_2a0.addr[0].ip;
      addr = (Curl_addrinfo *)0x0;
      pCVar25 = (Curl_addrinfo *)0x0;
      for (lVar24 = 0; lVar24 < dStack_2a0.numaddr; lVar24 = lVar24 + 1) {
        iVar3 = ((dohaddr *)((long)paVar31 + -4))->type;
        lVar13 = 0x1c;
        if (iVar3 != 0x1c) {
          lVar13 = 0x10;
        }
        pCVar16 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar15 + 0x31 + lVar13);
        if (pCVar16 == (Curl_addrinfo *)0x0) {
          Curl_freeaddrinfo(addr);
          goto LAB_0045f874;
        }
        pCVar16->ai_addr = (sockaddr *)(pCVar16 + 1);
        pcVar7 = (char *)((long)&pCVar16[1].ai_flags + lVar13);
        pCVar16->ai_canonname = pcVar7;
        memcpy(pcVar7,pcVar21,sVar15 + 1);
        if (addr == (Curl_addrinfo *)0x0) {
          addr = pCVar16;
        }
        if (pCVar25 != (Curl_addrinfo *)0x0) {
          pCVar25->ai_next = pCVar16;
        }
        pCVar16->ai_family = (uint)(iVar3 == 0x1c) * 8 + 2;
        pCVar16->ai_socktype = 1;
        pCVar16->ai_addrlen = (curl_socklen_t)lVar13;
        psVar5 = pCVar16->ai_addr;
        if (iVar3 == 0x1c) {
          uVar6 = *(undefined8 *)((long)paVar31 + 8);
          *(undefined8 *)(psVar5->sa_data + 6) = *(undefined8 *)paVar31;
          psVar5[1].sa_family = (short)uVar6;
          psVar5[1].sa_data[0] = (char)((ulong)uVar6 >> 0x10);
          psVar5[1].sa_data[1] = (char)((ulong)uVar6 >> 0x18);
          psVar5[1].sa_data[2] = (char)((ulong)uVar6 >> 0x20);
          psVar5[1].sa_data[3] = (char)((ulong)uVar6 >> 0x28);
          psVar5[1].sa_data[4] = (char)((ulong)uVar6 >> 0x30);
          psVar5[1].sa_data[5] = (char)((ulong)uVar6 >> 0x38);
          sVar18 = 10;
        }
        else {
          *(undefined4 *)(psVar5->sa_data + 2) = *(undefined4 *)paVar31;
          sVar18 = 2;
        }
        psVar5->sa_family = sVar18;
        *(ushort *)psVar5->sa_data = uVar29 << 8 | uVar29 >> 8;
        paVar31 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar31 + 0x14);
        pCVar25 = pCVar16;
      }
      if (addr == (Curl_addrinfo *)0x0) {
LAB_0045f874:
        de_cleanup(&dStack_2a0);
        goto LAB_0045f881;
      }
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCVar17 = Curl_cache_addr(data,addr,pdVar4->host,pdVar4->port);
      CVar10 = CURLE_COULDNT_RESOLVE_HOST;
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      if (pCVar17 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(addr);
      }
      else {
        (data->state).async.dns = pCVar17;
        *ppCStack_330 = pCVar17;
        CVar10 = CURLE_OK;
      }
    }
    de_cleanup(&dStack_2a0);
    (*Curl_cfree)((data->req).doh);
    (data->req).doh = (dohdata *)0x0;
  }
  return CVar10;
LAB_0045f06e:
  do {
    auStack_328[0] = uVar23;
    bVar32 = uVar29 == 0;
    uVar29 = uVar29 - 1;
    if (bVar32) {
      uVar29 = *(ushort *)(puVar11 + 8) << 8 | *(ushort *)(puVar11 + 8) >> 8;
      uVar23 = auStack_328[0];
      goto LAB_0045f32d;
    }
    DVar8 = skipqname(puVar11,sVar12,auStack_328);
    if (DVar8 != DOH_OK) goto LAB_0045f42d;
    if (sVar12 < auStack_328[0] + 2) goto LAB_0045f429;
    uVar26 = *(ushort *)(puVar11 + (int)auStack_328[0]) << 8 |
             *(ushort *)(puVar11 + (int)auStack_328[0]) >> 8;
    DVar9 = (DNStype)uVar26;
    if (((uVar26 != 5) && (DVar9 != DNS_TYPE_DNAME)) && (DVar2 != DVar9)) {
      DVar8 = DOH_DNS_UNEXPECTED_TYPE;
      goto LAB_0045f42d;
    }
    if (sVar12 < auStack_328[0] + 4) goto LAB_0045f429;
    if ((ushort)(*(ushort *)(puVar11 + (int)(auStack_328[0] + 2)) << 8 |
                *(ushort *)(puVar11 + (int)(auStack_328[0] + 2)) >> 8) != 1) {
      DVar8 = DOH_DNS_UNEXPECTED_CLASS;
      goto LAB_0045f42d;
    }
    if (sVar12 < auStack_328[0] + 8) goto LAB_0045f429;
    uVar23 = *(uint *)(puVar11 + (int)(auStack_328[0] + 4));
    uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 | uVar23 << 0x18;
    if (uVar23 < dStack_2a0.ttl) {
      dStack_2a0.ttl = uVar23;
    }
    uVar27 = auStack_328[0] + 10;
    uVar30 = (ulong)uVar27;
    if (sVar12 < uVar30) goto LAB_0045f429;
    uVar22 = *(ushort *)(puVar11 + (int)(auStack_328[0] + 8)) << 8 |
             *(ushort *)(puVar11 + (int)(auStack_328[0] + 8)) >> 8;
    uVar23 = uVar22 + uVar27;
    sVar28 = (size_t)uVar23;
    if (sVar12 < sVar28) goto LAB_0045f429;
    if (uVar26 == 0x1c) {
      if (uVar22 != 0x10) {
LAB_0045f3b0:
        DVar8 = DOH_DNS_RDATA_LEN;
        goto LAB_0045f42d;
      }
      lVar13 = (long)dStack_2a0.numaddr;
      if (lVar13 < 0x18) {
        dStack_2a0.addr[lVar13].type = 0x1c;
        uVar6 = *(undefined8 *)(puVar11 + (int)uVar27 + 8);
        *(undefined8 *)&dStack_2a0.addr[lVar13].ip = *(undefined8 *)(puVar11 + (int)uVar27);
        *(undefined8 *)((long)&dStack_2a0.addr[lVar13].ip + 8) = uVar6;
LAB_0045f2f2:
        dStack_2a0.numaddr = dStack_2a0.numaddr + 1;
      }
      goto LAB_0045f06e;
    }
    if (DVar9 != DNS_TYPE_CNAME) {
      if (DVar9 == DNS_TYPE_A) {
        if (uVar22 != 4) goto LAB_0045f3b0;
        lVar13 = (long)dStack_2a0.numaddr;
        if (lVar13 < 0x18) {
          dStack_2a0.addr[lVar13].type = 1;
          *(undefined4 *)&dStack_2a0.addr[lVar13].ip = *(undefined4 *)(puVar11 + (int)uVar27);
          goto LAB_0045f2f2;
        }
      }
      goto LAB_0045f06e;
    }
    lVar13 = (long)dStack_2a0.numcname;
    if (lVar13 == 4) goto LAB_0045f06e;
    dStack_2a0.numcname = dStack_2a0.numcname + 1;
    s_00 = dStack_2a0.cname + lVar13;
    uVar19 = 0xffffff81;
    do {
      if (sVar12 <= uVar30) goto LAB_0045f429;
      bVar1 = puVar11[uVar30];
      uVar20 = uVar19;
      if ((bVar1 & 0xc0) == 0) {
        uVar27 = (int)uVar30 + 1;
        uVar30 = (ulong)uVar27;
        if ((ulong)bVar1 != 0) {
          uStack_338 = uVar19;
          sVar14 = Curl_dyn_len(s_00);
          if ((sVar14 == 0) || (CVar10 = Curl_dyn_addn(s_00,".",1), CVar10 == CURLE_OK)) {
            uVar30 = (ulong)(bVar1 + uVar27);
            if (sVar12 < uVar30) goto LAB_0045f3a8;
            CVar10 = Curl_dyn_addn(s_00,puVar11 + uVar27,(ulong)bVar1);
            uVar20 = uStack_338;
            if (CVar10 == CURLE_OK) goto LAB_0045f2a9;
          }
          DVar8 = DOH_OUT_OF_MEM;
          goto LAB_0045f42d;
        }
      }
      else {
        if ((bVar1 & 0xc0) != 0xc0) {
LAB_0045f3a8:
          DVar8 = DOH_DNS_BAD_LABEL;
          goto LAB_0045f42d;
        }
        uVar30 = (ulong)((int)uVar30 + 1);
        if (sVar12 <= uVar30) goto LAB_0045f429;
        uVar30 = (ulong)((uint)puVar11[uVar30] | (bVar1 & 0x3f) << 8);
      }
LAB_0045f2a9:
    } while ((bVar1 != 0) && (uVar19 = (ulong)((int)uVar20 + 1), (int)uVar20 != 0));
  } while (bVar1 == 0);
  DVar8 = DOH_DNS_LABEL_LOOP;
  goto LAB_0045f42d;
  while( true ) {
    uVar23 = (uint)(ushort)(*(ushort *)(puVar11 + (int)(auStack_328[0] + 8)) << 8 |
                           *(ushort *)(puVar11 + (int)(auStack_328[0] + 8)) >> 8) +
             auStack_328[0] + 10;
    sVar28 = (size_t)uVar23;
    if (sVar12 < sVar28) break;
LAB_0045f32d:
    auStack_328[0] = uVar23;
    bVar32 = uVar29 == 0;
    uVar29 = uVar29 - 1;
    if (bVar32) {
      uVar29 = *(ushort *)(puVar11 + 10) << 8 | *(ushort *)(puVar11 + 10) >> 8;
      uVar23 = auStack_328[0];
      goto LAB_0045f3c1;
    }
    DVar8 = skipqname(puVar11,sVar12,auStack_328);
    if (DVar8 != DOH_OK) goto LAB_0045f42d;
    if ((sVar12 < auStack_328[0] + 8) || (sVar12 < auStack_328[0] + 10)) break;
  }
  goto LAB_0045f429;
  while( true ) {
    uVar23 = (uint)(ushort)(*(ushort *)(puVar11 + (int)(auStack_328[0] + 8)) << 8 |
                           *(ushort *)(puVar11 + (int)(auStack_328[0] + 8)) >> 8) +
             auStack_328[0] + 10;
    sVar28 = (size_t)uVar23;
    if (sVar12 < sVar28) break;
LAB_0045f3c1:
    auStack_328[0] = uVar23;
    bVar32 = uVar29 == 0;
    uVar29 = uVar29 - 1;
    if (bVar32) {
      DVar8 = DOH_DNS_MALFORMAT;
      if (sVar12 == sVar28) {
        DVar8 = DOH_OK;
        if (dStack_2a0.numaddr == 0 && dStack_2a0.numcname == 0) {
          DVar8 = DOH_NO_CONTENT;
        }
        if (uVar26 == 2) {
          DVar8 = DOH_OK;
        }
      }
      goto LAB_0045f42d;
    }
    DVar8 = skipqname(puVar11,sVar12,auStack_328);
    if (DVar8 != DOH_OK) goto LAB_0045f42d;
    if ((sVar12 < auStack_328[0] + 8) || (sVar12 < auStack_328[0] + 10)) break;
  }
LAB_0045f429:
  DVar8 = DOH_DNS_OUT_OF_RANGE;
LAB_0045f42d:
  aDStack_340[lVar24] = DVar8;
  Curl_dyn_free(s);
  if (DVar8 != DOH_OK) {
    pcVar21 = "AAAA";
    if (pdVar4->probe[lVar24].dnstype == DNS_TYPE_A) {
      pcVar21 = "A";
    }
    Curl_infof(data,"DoH: %s type %s for %s",(long)&errors_rel + (long)(int)(&errors_rel)[DVar8],
               pcVar21,pdVar4->host);
  }
LAB_0045f48e:
  lVar24 = lVar24 + 1;
  goto LAB_0045ef7a;
}

Assistant:

CURLcode Curl_resolv_check(struct Curl_easy *data,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)data;
  (void)dns;
#endif
#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh)
    return Curl_doh_is_resolved(data, dns);
#endif
  return Curl_resolver_is_resolved(data, dns);
}